

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

SlicePlane * polyscope::addSceneSlicePlane(bool initiallyVisible)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar2;
  long *plVar3;
  _Head_base<0UL,_polyscope::SlicePlane_*,_false> _Var4;
  char cVar5;
  char cVar6;
  long *plVar7;
  SlicePlane *pSVar8;
  mapped_type *pmVar9;
  long *plVar10;
  ulong uVar11;
  unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *s;
  pointer *__ptr;
  ulong __val;
  string __str;
  string newName;
  _Head_base<0UL,_polyscope::SlicePlane_*,_false> local_88;
  uint local_80;
  undefined1 local_78 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 local_38 [16];
  
  cVar6 = '\x01';
  __val = (long)DAT_005f9d30 - (long)state::slicePlanes >> 3;
  if (9 < __val) {
    uVar11 = __val;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      if (uVar11 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_002371d2;
      }
      if (uVar11 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_002371d2;
      }
      if (uVar11 < 10000) goto LAB_002371d2;
      bVar2 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (bVar2);
    cVar6 = cVar6 + '\x01';
  }
LAB_002371d2:
  local_88._M_head_impl = (SlicePlane *)local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_88._M_head_impl,local_80,__val);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x347480);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_78._32_8_ = *plVar10;
    local_78._40_8_ = plVar7[3];
    local_78._16_8_ = local_78 + 0x20;
  }
  else {
    local_78._32_8_ = *plVar10;
    local_78._16_8_ = (long *)*plVar7;
  }
  local_78._24_8_ = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_88._M_head_impl != (SlicePlane *)local_78) {
    operator_delete(local_88._M_head_impl);
  }
  pSVar8 = (SlicePlane *)operator_new(0x710);
  local_48._M_allocated_capacity = (size_type)(local_78 + 0x40);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_78 + 0x30),local_78._16_8_,
             (undefined1 *)(local_78._24_8_ + local_78._16_8_));
  SlicePlane::SlicePlane(pSVar8,(string *)(local_78 + 0x30));
  local_88._M_head_impl = pSVar8;
  std::
  vector<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>,std::allocator<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>>>
  ::emplace_back<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>>
            ((vector<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>,std::allocator<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>>>
              *)&state::slicePlanes,
             (unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *)
             &local_88);
  _Var4._M_head_impl = local_88._M_head_impl;
  if (local_88._M_head_impl != (SlicePlane *)0x0) {
    SlicePlane::~SlicePlane(local_88._M_head_impl);
    operator_delete(_Var4._M_head_impl);
  }
  local_88._M_head_impl = (SlicePlane *)0x0;
  if ((undefined1 *)local_48._M_allocated_capacity != local_78 + 0x40) {
    operator_delete((void *)local_48._M_allocated_capacity);
  }
  pSVar8 = (SlicePlane *)DAT_005f9d30[-1];
  plVar7 = state::slicePlanes;
  plVar10 = DAT_005f9d30;
  if (!initiallyVisible) {
    (pSVar8->drawPlane).value = false;
    pmVar9 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&detail::persistentCache_bool,&(pSVar8->drawPlane).name);
    *pmVar9 = false;
    (pSVar8->drawPlane).holdsDefaultValue = false;
    requestRedraw();
    SlicePlane::setDrawWidget(pSVar8,false);
    plVar7 = state::slicePlanes;
    plVar10 = DAT_005f9d30;
  }
  for (; plVar3 = DAT_005f9d30, plVar7 != DAT_005f9d30; plVar7 = plVar7 + 1) {
    lVar1 = *plVar7;
    DAT_005f9d30 = plVar10;
    *(undefined8 *)(lVar1 + 0x1d0) = 0;
    this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x1d8);
    *(undefined8 *)(lVar1 + 0x1d8) = 0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    plVar10 = DAT_005f9d30;
    DAT_005f9d30 = plVar3;
  }
  DAT_005f9d30 = plVar10;
  if ((undefined1 *)local_78._16_8_ != local_78 + 0x20) {
    operator_delete((void *)local_78._16_8_);
  }
  return pSVar8;
}

Assistant:

SlicePlane* addSceneSlicePlane(bool initiallyVisible) {
  size_t nPlanes = state::slicePlanes.size();
  std::string newName = "Scene Slice Plane " + std::to_string(nPlanes);
  state::slicePlanes.emplace_back(std::unique_ptr<SlicePlane>(new SlicePlane(newName)));
  nPlanes++;
  SlicePlane* newPlane = state::slicePlanes.back().get();
  if (!initiallyVisible) {
    newPlane->setDrawPlane(false);
    newPlane->setDrawWidget(false);
  }
  for (std::unique_ptr<SlicePlane>& s : state::slicePlanes) {
    s->resetVolumeSliceProgram();
  }
  return newPlane;
}